

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::FileMonitorTask::checkArguments
          (FileMonitorTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterOrThis)

{
  pointer ppEVar1;
  Expression *this_00;
  Type *this_01;
  Type *pTVar2;
  long lVar3;
  long lVar4;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  this_01 = FileDisplayTask::checkArguments
                      (&this->super_FileDisplayTask,context,args,range,iterOrThis);
  pTVar2 = this_01->canonical;
  if (pTVar2 == (Type *)0x0) {
    Type::resolveCanonical(this_01);
    pTVar2 = this_01->canonical;
  }
  if ((pTVar2->super_Symbol).kind != ErrorType) {
    lVar4 = (args->_M_extent)._M_extent_value << 3;
    if (lVar4 != 8) {
      ppEVar1 = args->_M_ptr;
      lVar3 = 8;
      local_30.context = context;
      do {
        this_00 = *(Expression **)((long)ppEVar1 + lVar3);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (this_00,this_00,&local_30);
        lVar3 = lVar3 + 8;
      } while (lVar4 != lVar3);
    }
  }
  return this_01;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = FileDisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args.subspan(1))
            arg->visit(visitor);

        return result;
    }